

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

string * netlist::resolveSymbolHierPath_abi_cxx11_(Symbol *symbol)

{
  Scope *this;
  Symbol *this_00;
  iterator __i2;
  iterator __k1;
  iterator __k2;
  Symbol *in_RSI;
  string *in_RDI;
  string newSuffix;
  undefined1 in_stack_000000a0 [16];
  string oldSuffix;
  string_view *modportName;
  Symbol *modportSymbol;
  string *buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Symbol *in_stack_fffffffffffffe58;
  __const_iterator in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  char *local_140;
  undefined8 local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string_view *local_110;
  Symbol *local_f8;
  undefined1 local_e9;
  Symbol *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined8 uStack_b0;
  string_view *local_a8;
  char *local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 *local_88;
  undefined8 *local_80;
  undefined1 local_78 [32];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  string_view *local_38;
  string_view *local_30;
  char *local_28;
  undefined8 uStack_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_e9 = 0;
  local_e8 = in_RSI;
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_(in_stack_fffffffffffffe58);
  if (local_e8->kind == ModportPort) {
    this = slang::ast::Symbol::getParentScope(local_e8);
    this_00 = slang::ast::Scope::asSymbol(this);
    local_110 = &this_00->name;
    local_140 = ".{}.{}";
    local_138 = 6;
    local_30 = &this_00->name;
    local_38 = &local_e8->name;
    local_18 = &local_130;
    local_28 = ".{}.{}";
    uStack_20 = 6;
    local_48 = ".{}.{}";
    uStack_40 = 6;
    local_f8 = this_00;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)this,
               (basic_string_view<char,_std::char_traits<char>_> *)this_00);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)this,
               (basic_string_view<char,_std::char_traits<char>_> *)this_00);
    local_8 = &local_58;
    local_10 = local_78;
    local_58 = 0xdd;
    local_50 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000a0,(format_args)stack0x00000090);
    local_a8 = &local_e8->name;
    local_90 = &local_160;
    local_a0 = ".{}";
    uStack_98 = 3;
    local_b8 = ".{}";
    uStack_b0 = 3;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)this,
               (basic_string_view<char,_std::char_traits<char>_> *)this_00);
    local_80 = &local_c8;
    local_88 = local_d8;
    local_c8 = 0xd;
    local_c0 = local_88;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000a0,(format_args)stack0x00000090);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
              (&local_130);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00,(difference_type)in_stack_fffffffffffffe30);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (in_stack_fffffffffffffe30,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe28);
    __i2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (in_stack_fffffffffffffe30,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe28);
    this_01 = &local_160;
    __k1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (in_stack_fffffffffffffe28);
    __k2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (in_RDI,in_stack_fffffffffffffe70,(__const_iterator)__i2._M_current,__k1,__k2);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
  }
  return in_RDI;
}

Assistant:

static std::string resolveSymbolHierPath(const ast::Symbol& symbol) {

    // Resolve the hierarchical path of the symbol.
    auto buffer = symbol.getHierarchicalPath();

    // Is the symbol is a modport, use the modport name to adjust the
    // hierachical path to match the corresponding variable declaration in the
    // interface.
    if (symbol.kind == ast::SymbolKind::ModportPort) {
        auto const& modportSymbol = symbol.getParentScope()->asSymbol();
        auto& modportName = modportSymbol.name;
        auto oldSuffix = fmt::format(".{}.{}", modportSymbol.name, symbol.name);
        auto newSuffix = fmt::format(".{}", symbol.name);
        DEBUG_PRINT("hierPath={}, oldSuffix={}, newSuffix={}\n", buffer, oldSuffix, newSuffix);
        SLANG_ASSERT(buffer.ends_with(oldSuffix));
        buffer.replace(buffer.end() - (ptrdiff_t)oldSuffix.length(), buffer.end(),
                       newSuffix.begin(), newSuffix.end());
    }

    return buffer;
}